

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numberformatter.h
# Opt level: O2

MacroProps * __thiscall
icu_63::number::impl::MacroProps::operator=(MacroProps *this,MacroProps *param_1)

{
  PluralRules *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  UNumberSignDisplay UVar4;
  long lVar5;
  Precision *pPVar6;
  Precision *pPVar7;
  byte bVar8;
  
  bVar8 = 0;
  (this->notation).fUnion.scientific.fExponentSignDisplay =
       (param_1->notation).fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)&this->notation = *(undefined8 *)&param_1->notation;
  MeasureUnit::operator=(&this->unit,&param_1->unit);
  MeasureUnit::operator=(&this->perUnit,&param_1->perUnit);
  pPVar6 = &param_1->precision;
  pPVar7 = &this->precision;
  for (lVar5 = 0x45; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(char *)&pPVar7->fType = (char)pPVar6->fType;
    pPVar6 = (Precision *)((long)pPVar6 + (ulong)bVar8 * -2 + 1);
    pPVar7 = (Precision *)((long)pPVar7 + (ulong)bVar8 * -2 + 1);
  }
  SymbolsWrapper::operator=(&this->symbols,&param_1->symbols);
  UVar4 = param_1->sign;
  this->unitWidth = param_1->unitWidth;
  this->sign = UVar4;
  this->decimal = param_1->decimal;
  Scale::operator=(&this->scale,&param_1->scale);
  pPVar1 = param_1->rules;
  uVar2 = *(undefined8 *)((long)&param_1->rules + 4);
  uVar3 = *(undefined8 *)((long)&param_1->currencySymbols + 4);
  this->affixProvider = param_1->affixProvider;
  this->rules = pPVar1;
  *(undefined8 *)((long)&this->rules + 4) = uVar2;
  *(undefined8 *)((long)&this->currencySymbols + 4) = uVar3;
  Locale::operator=(&this->locale,&param_1->locale);
  return this;
}

Assistant:

struct U_I18N_API MacroProps : public UMemory {
    /** @internal */
    Notation notation;

    /** @internal */
    MeasureUnit unit; // = NoUnit::base();

    /** @internal */
    MeasureUnit perUnit; // = NoUnit::base();

    /** @internal */
    Precision precision;  // = Precision();  (bogus)

    /** @internal */
    UNumberFormatRoundingMode roundingMode = UNUM_ROUND_HALFEVEN;

    /** @internal */
    Grouper grouper;  // = Grouper();  (bogus)

    /** @internal */
    Padder padder;    // = Padder();   (bogus)

    /** @internal */
    IntegerWidth integerWidth; // = IntegerWidth(); (bogus)

    /** @internal */
    SymbolsWrapper symbols;

    // UNUM_XYZ_COUNT denotes null (bogus) values.

    /** @internal */
    UNumberUnitWidth unitWidth = UNUM_UNIT_WIDTH_COUNT;

    /** @internal */
    UNumberSignDisplay sign = UNUM_SIGN_COUNT;

    /** @internal */
    UNumberDecimalSeparatorDisplay decimal = UNUM_DECIMAL_SEPARATOR_COUNT;

    /** @internal */
    Scale scale;  // = Scale();  (benign value)

    /** @internal */
    const AffixPatternProvider* affixProvider = nullptr;  // no ownership

    /** @internal */
    const PluralRules* rules = nullptr;  // no ownership

    /** @internal */
    const CurrencySymbols* currencySymbols = nullptr;  // no ownership

    /** @internal */
    int32_t threshold = DEFAULT_THRESHOLD;

    /** @internal */
    Locale locale;

    // NOTE: Uses default copy and move constructors.

    /**
     * Check all members for errors.
     * @internal
     */
    bool copyErrorTo(UErrorCode &status) const {
        return notation.copyErrorTo(status) || precision.copyErrorTo(status) ||
               padder.copyErrorTo(status) || integerWidth.copyErrorTo(status) ||
               symbols.copyErrorTo(status) || scale.copyErrorTo(status);
    }
}